

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O0

boolean hurtle_step(void *arg,int x,int y)

{
  bool bVar1;
  xchar x_00;
  xchar y_00;
  boolean bVar2;
  int iVar3;
  int iVar4;
  obj *obj_00;
  char *pcVar5;
  trap *trap;
  monst *local_68;
  char *pcStack_58;
  boolean too_much;
  char *s;
  trap *ttmp;
  boolean may_pass;
  monst *mon;
  obj *obj;
  int *range;
  int oy;
  int ox;
  int y_local;
  int x_local;
  void *arg_local;
  
  ttmp._7_1_ = '\x01';
  if ((((x < 1) || (0x4f < x)) || (y < 0)) || (0x14 < y)) {
    pline("You feel the spirits holding you back.");
    arg_local._7_1_ = '\0';
  }
  else {
    x_00 = (xchar)x;
    y_00 = (xchar)y;
    bVar2 = in_out_region(level,x_00,y_00);
    if (bVar2 == '\0') {
      arg_local._7_1_ = '\0';
    }
    else if (*arg == 0) {
      arg_local._7_1_ = '\0';
    }
    else {
      if ((((u.uprops[0x3e].intrinsic == 0) && (u.uprops[0x3e].extrinsic == 0)) &&
          (((youmonst.data)->mflags1 & 8) == 0)) ||
         (ttmp._7_1_ = may_passwall(level,x_00,y_00), ttmp._7_1_ == '\0')) {
        if ((level->locations[x][y].typ < '\x11') || (bVar2 = closed_door(level,x,y), bVar2 != '\0')
           ) {
          pline("Ouch!");
          if ((level->locations[x][y].typ == '\r') ||
             ((((*(uint *)&(level->flags).field_0x8 >> 0x14 & 1) != 0 &&
               (level->locations[x][y].typ == '\0')) || (level->locations[x][y].typ == '\x0e')))) {
            pcStack_58 = "bumping into a tree";
          }
          else if (level->locations[x][y].typ < '\x11') {
            pcStack_58 = "bumping into a wall";
          }
          else {
            pcStack_58 = "bumping into a door";
          }
          iVar3 = rnd(*arg + 2);
          losehp(iVar3,pcStack_58,1);
          return '\0';
        }
        if (level->locations[x][y].typ == '\x16') {
          pline("You crash into some iron bars.  Ouch!");
          iVar3 = rnd(*arg + 2);
          losehp(iVar3,"crashing into iron bars",1);
          return '\0';
        }
        obj_00 = sobj_at(0x214,level,x,y);
        if (obj_00 != (obj *)0x0) {
          pcVar5 = xname(obj_00);
          pline("You bump into a %s.  Ouch!",pcVar5);
          iVar3 = rnd(*arg + 2);
          losehp(iVar3,"bumping into a boulder",1);
          return '\0';
        }
        if (ttmp._7_1_ == '\0') {
          pline("You smack into something!");
          iVar3 = rnd(*arg + 2);
          losehp(iVar3,"touching the edge of the universe",1);
          return '\0';
        }
        if (((u.ux != x) && (u.uy != y)) &&
           ((bVar2 = bad_rock(youmonst.data,'\x01',u.ux,y_00), bVar2 != '\0' &&
            (bVar2 = bad_rock(youmonst.data,'\x01',x_00,u.uy), bVar2 != '\0')))) {
          bVar1 = false;
          if (invent != (obj *)0x0) {
            iVar3 = inv_weight();
            iVar4 = weight_cap();
            bVar1 = 600 < iVar3 + iVar4;
          }
          if ((2 < (youmonst.data)->msize) || (bVar1)) {
            pcVar5 = "";
            if (bVar1) {
              pcVar5 = "and all your belongings ";
            }
            pline("You %sget forcefully wedged into a crevice.",pcVar5);
            iVar3 = rnd(*arg + 2);
            losehp(iVar3,"wedging into a narrow crevice",1);
            return '\0';
          }
        }
      }
      if ((level->monsters[x][y] == (monst *)0x0) ||
         ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
        local_68 = (monst *)0x0;
      }
      else {
        local_68 = level->monsters[x][y];
      }
      if (local_68 == (monst *)0x0) {
        if ((((u.ux == x) || (u.uy == y)) ||
            (bVar2 = bad_rock(youmonst.data,'\x01',u.ux,y_00), bVar2 == '\0')) ||
           ((bVar2 = bad_rock(youmonst.data,'\x01',x_00,u.uy), bVar2 == '\0' ||
            (u.uz.dnum != dungeon_topology.d_sokoban_dnum)))) {
          iVar3 = (int)u.ux;
          iVar4 = (int)u.uy;
          u.ux = x_00;
          u.uy = y_00;
          newsym(iVar3,iVar4);
          vision_recalc(1);
          flush_screen();
          trap = t_at(level,x,y);
          if (trap != (trap *)0x0) {
            if ((trap->field_0x8 & 0x1f) == 0x12) {
              dotrap(trap,0);
              return '\0';
            }
            if ((trap->field_0x8 & 0x1f) == 0xf) {
              pline("The ground vibrates as you pass it.");
              dotrap(trap,0);
            }
            else if ((trap->field_0x8 & 0x1f) == 10) {
              dotrap(trap,0);
            }
            else {
              if (((((trap->field_0x8 & 0x1f) == 0xb) || ((trap->field_0x8 & 0x1f) == 0xc)) ||
                  (((trap->field_0x8 & 0x1f) == 0xd || ((trap->field_0x8 & 0x1f) == 0xe)))) &&
                 (u.uz.dnum == dungeon_topology.d_sokoban_dnum)) {
                dotrap(trap,0);
                *(undefined4 *)arg = 0;
                return '\x01';
              }
              if (((byte)trap->field_0x8 >> 5 & 1) != 0) {
                pcVar5 = "a";
                if ((trap->field_0x8 & 0x1f) == 1) {
                  pcVar5 = "an";
                }
                pline("You pass right over %s %s.",pcVar5,
                      trapexplain[(int)((trap->field_0x8 & 0x1f) - 1)]);
              }
            }
          }
          iVar3 = *arg;
          *(int *)arg = iVar3 + -1;
          if (iVar3 + -1 < 0) {
            *(undefined4 *)arg = 0;
          }
          if (*arg != 0) {
            (*windowprocs.win_delay)();
          }
          arg_local._7_1_ = '\x01';
        }
        else {
          pline("You come to an abrupt halt!");
          arg_local._7_1_ = '\0';
        }
      }
      else {
        pcVar5 = a_monnam(local_68);
        pline("You bump into %s.",pcVar5);
        wakeup(local_68);
        arg_local._7_1_ = '\0';
      }
    }
  }
  return arg_local._7_1_;
}

Assistant:

boolean hurtle_step(void *arg, int x, int y)
{
    int ox, oy, *range = (int *)arg;
    struct obj *obj;
    struct monst *mon;
    boolean may_pass = TRUE;
    struct trap *ttmp;
    
    if (!isok(x,y)) {
	pline("You feel the spirits holding you back.");
	return FALSE;
    } else if (!in_out_region(level, x, y)) {
	return FALSE;
    } else if (*range == 0) {
	return FALSE;			/* previous step wants to stop now */
    }

    if (!Passes_walls || !(may_pass = may_passwall(level, x, y))) {
	if (IS_ROCK(level->locations[x][y].typ) || closed_door(level, x,y)) {
	    const char *s;

	    pline("Ouch!");
	    if (IS_TREES(level, level->locations[x][y].typ))
		s = "bumping into a tree";
	    else if (IS_ROCK(level->locations[x][y].typ))
		s = "bumping into a wall";
	    else
		s = "bumping into a door";
	    losehp(rnd(2+*range), s, KILLED_BY);
	    return FALSE;
	}
	if (level->locations[x][y].typ == IRONBARS) {
	    pline("You crash into some iron bars.  Ouch!");
	    losehp(rnd(2+*range), "crashing into iron bars", KILLED_BY);
	    return FALSE;
	}
	if ((obj = sobj_at(BOULDER, level, x,y)) != 0) {
	    pline("You bump into a %s.  Ouch!", xname(obj));
	    losehp(rnd(2+*range), "bumping into a boulder", KILLED_BY);
	    return FALSE;
	}
	if (!may_pass) {
	    /* did we hit a no-dig non-wall position? */
	    pline("You smack into something!");
	    losehp(rnd(2+*range), "touching the edge of the universe", KILLED_BY);
	    return FALSE;
	}
	if ((u.ux - x) && (u.uy - y) &&
		bad_rock(youmonst.data, TRUE, u.ux,y) &&
		bad_rock(youmonst.data, TRUE, x,u.uy)) {
	    boolean too_much = (invent && (inv_weight() + weight_cap() > 600));
	    /* Move at a diagonal. */
	    if (bigmonst(youmonst.data) || too_much) {
		pline("You %sget forcefully wedged into a crevice.",
			too_much ? "and all your belongings " : "");
		losehp(rnd(2+*range), "wedging into a narrow crevice", KILLED_BY);
		return FALSE;
	    }
	}
    }

    if ((mon = m_at(level, x, y)) != 0) {
	pline("You bump into %s.", a_monnam(mon));
	wakeup(mon);
	return FALSE;
    }
    if ((u.ux - x) && (u.uy - y) &&
	bad_rock(youmonst.data, TRUE, u.ux,y) &&
	bad_rock(youmonst.data, TRUE, x,u.uy)) {
	/* Move at a diagonal. */
	if (In_sokoban(&u.uz)) {
	    pline("You come to an abrupt halt!");
	    return FALSE;
	}
    }

    ox = u.ux;
    oy = u.uy;
    u.ux = x;
    u.uy = y;
    newsym(ox, oy);		/* update old position */
    vision_recalc(1);		/* update for new position */
    flush_screen();
    /* FIXME:
     * Each trap should really trigger on the recoil if
     * it would trigger during normal movement. However,
     * not all the possible side-effects of this are
     * tested [as of 3.4.0] so we trigger those that
     * we have tested, and offer a message for the
     * ones that we have not yet tested.
     */
    if ((ttmp = t_at(level, x, y)) != 0) {
    	if (ttmp->ttyp == MAGIC_PORTAL) {
    		dotrap(ttmp,0);
    		return FALSE;
        } else if (ttmp->ttyp == VIBRATING_SQUARE) {
                pline("The ground vibrates as you pass it.");
                dotrap(ttmp,0); /* doesn't print messages */
	} else if (ttmp->ttyp == FIRE_TRAP) {
    		dotrap(ttmp,0);
	} else if ((ttmp->ttyp == PIT || ttmp->ttyp == SPIKED_PIT ||
		    ttmp->ttyp == HOLE || ttmp->ttyp == TRAPDOOR) &&
		   In_sokoban(&u.uz)) {
		/* Air currents overcome the recoil */
    		dotrap(ttmp,0);
		*range = 0;
		return TRUE;
    	} else {
		if (ttmp->tseen)
		    pline("You pass right over %s %s.",
		    	(ttmp->ttyp == ARROW_TRAP) ? "an" : "a",
		    	trapexplain[ttmp->ttyp-1]);
    	}
    }
    if (--*range < 0)		/* make sure our range never goes negative */
	*range = 0;
    if (*range != 0)
	win_delay_output();
    return TRUE;
}